

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,str_writer<wchar_t> f)

{
  ulong n;
  type pwVar1;
  wchar_t *__dest;
  wchar_t *__src;
  unsigned_long __n2;
  size_t sVar2;
  ulong uVar3;
  char_type fill;
  wchar_t local_2c;
  
  sVar2 = f.size;
  __src = f.s;
  n = (ulong)spec->width_;
  uVar3 = n - size;
  if (n < size || uVar3 == 0) {
    pwVar1 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,size
                       );
    if (sVar2 != 0) {
      memmove(pwVar1,__src,sVar2 << 2);
      return;
    }
  }
  else {
    pwVar1 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,n);
    local_2c = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      pwVar1 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar3 >> 1,&local_2c);
      if (sVar2 != 0) {
        memmove(pwVar1,__src,sVar2 * 4);
        pwVar1 = pwVar1 + sVar2;
      }
      uVar3 = uVar3 - (uVar3 >> 1);
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        __dest = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar3,&local_2c);
        if (sVar2 == 0) {
          return;
        }
        memmove(__dest,__src,sVar2 << 2);
        return;
      }
      if (sVar2 != 0) {
        memmove(pwVar1,__src,sVar2 * 4);
        pwVar1 = pwVar1 + sVar2;
      }
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar3,&local_2c);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}